

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O3

void builtinObject(BuiltinVariable *v)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  int *in_RSI;
  long lVar6;
  long in_FS_OFFSET;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  undefined1 auVar10 [16];
  QLatin1String QVar11;
  QLatin1String QVar12;
  QJsonArray dimArr;
  undefined1 *local_68;
  QJsonValueRef local_60 [16];
  QJsonValue local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)v = &DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)v);
  lVar6 = 0;
  lVar3 = 0;
LAB_0046c514:
  if (*(int *)(builtinTypeTab[0].k + lVar3 + 0x18) != *in_RSI) goto code_r0x0046c51a;
  pcVar4 = builtinTypeTab[0].k + lVar3;
  lVar6 = -1;
  pcVar2 = pcVar4;
  do {
    lVar6 = lVar6 + 1;
    cVar1 = *pcVar2;
    pcVar2 = pcVar2 + 1;
  } while (cVar1 != '\0');
  goto LAB_0046c544;
code_r0x0046c51a:
  lVar3 = lVar3 + 0x1c;
  if (lVar3 == 0x32c) goto code_r0x0046c527;
  goto LAB_0046c514;
code_r0x0046c527:
  pcVar4 = (char *)0x0;
LAB_0046c544:
  QVar11.m_data = pcVar4;
  QVar11.m_size = lVar6;
  QJsonValue::QJsonValue(local_50,QVar11);
  QVar7.m_data = (char *)0x4;
  QVar7.m_size = (qsizetype)v;
  local_60 = (QJsonValueRef  [16])QJsonObject::operator[](QVar7);
  QJsonValueRef::operator=(local_60,local_50);
  QJsonValue::~QJsonValue(local_50);
  lVar6 = 0;
  lVar3 = 0;
  do {
    if (*(int *)(typeTab[0].k + lVar3 + 0x14) == in_RSI[1]) {
      pcVar4 = typeTab[0].k + lVar3;
      lVar6 = -1;
      pcVar2 = pcVar4;
      do {
        lVar6 = lVar6 + 1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (cVar1 != '\0');
      goto LAB_0046c5c0;
    }
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x678);
  pcVar4 = (char *)0x0;
LAB_0046c5c0:
  QVar12.m_data = pcVar4;
  QVar12.m_size = lVar6;
  QJsonValue::QJsonValue(local_50,QVar12);
  QVar8.m_data = (char *)0x4;
  QVar8.m_size = (qsizetype)v;
  auVar10 = QJsonObject::operator[](QVar8);
  local_60 = (QJsonValueRef  [16])auVar10;
  QJsonValueRef::operator=(local_60,local_50);
  QJsonValue::~QJsonValue(local_50);
  if (*(long *)(in_RSI + 6) != 0) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)&local_68);
    lVar3 = *(long *)(in_RSI + 6);
    if (lVar3 != 0) {
      lVar6 = *(long *)(in_RSI + 4);
      lVar5 = 0;
      do {
        QJsonValue::QJsonValue(local_50,*(int *)(lVar6 + lVar5));
        QJsonArray::append((QJsonValue *)&local_68);
        QJsonValue::~QJsonValue(local_50);
        lVar5 = lVar5 + 4;
      } while (lVar3 << 2 != lVar5);
    }
    QJsonValue::QJsonValue(local_50,(QJsonArray *)&local_68);
    QVar9.m_data = (char *)0x9;
    QVar9.m_size = (qsizetype)v;
    auVar10 = QJsonObject::operator[](QVar9);
    local_60 = (QJsonValueRef  [16])auVar10;
    QJsonValueRef::operator=(local_60,local_50);
    QJsonValue::~QJsonValue(local_50);
    QJsonArray::~QJsonArray((QJsonArray *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonObject builtinObject(const QShaderDescription::BuiltinVariable &v)
{
    QJsonObject obj;

    obj[nameKey()] = builtinTypeStr(v.type);
    obj[typeKey()] = typeStr(v.varType);
    if (!v.arrayDims.isEmpty()) {
        QJsonArray dimArr;
        for (int dim : v.arrayDims)
            dimArr.append(dim);
        obj[arrayDimsKey()] = dimArr;
    }
    return obj;
}